

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O0

bool __thiscall SWDParser::IsOperation(SWDParser *this,SWDOperation *tran)

{
  BitState BVar1;
  BitState BVar2;
  BitState BVar3;
  bool bVar4;
  reference pvVar5;
  reference pSVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_160;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_158;
  const_iterator local_150;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_148;
  const_iterator local_140;
  vector<SWDBit,_std::allocator<SWDBit>_> *local_138;
  vector<SWDBit,_std::allocator<SWDBit>_> *local_130;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_128;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_120;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_118;
  SWDBit local_110;
  undefined1 local_e8 [8];
  SWDBit bit;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_b8;
  byte local_a9;
  ulong uStack_a8;
  bool all_zeros;
  size_t ndx;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_98;
  iterator bi;
  bool read_rising;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_80;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_78;
  const_iterator local_70;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_68;
  const_iterator local_60;
  vector<SWDBit,_std::allocator<SWDBit>_> *local_58;
  vector<SWDBit,_std::allocator<SWDBit>_> *local_50;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_48;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_40;
  __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_> local_38;
  uint local_2c;
  ulong uStack_28;
  int check;
  size_t cnt;
  SWDOperation *tran_local;
  SWDParser *this_local;
  
  cnt = (size_t)tran;
  tran_local = (SWDOperation *)this;
  SWDOperation::Clear(tran);
  BufferBits(this,0xc);
  *(undefined1 *)(cnt + 4) = 0;
  for (uStack_28 = 0; uStack_28 < 8; uStack_28 = uStack_28 + 1) {
    *(char *)(cnt + 4) = (char)((int)(uint)*(byte *)(cnt + 4) >> 1);
    pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,uStack_28);
    bVar4 = SWDBit::IsHigh(pvVar5,true);
    bVar9 = 0;
    if (bVar4) {
      bVar9 = 0x80;
    }
    *(byte *)(cnt + 4) = *(byte *)(cnt + 4) | bVar9;
  }
  if ((*(byte *)(cnt + 4) & 0xc1) == 0x81) {
    *(bool *)cnt = (*(byte *)(cnt + 4) & 2) != 0;
    *(bool *)(cnt + 1) = (*(byte *)(cnt + 4) & 4) != 0;
    *(char *)(cnt + 2) = (char)((int)(*(byte *)(cnt + 4) & 0x18) >> 1);
    *(bool *)(cnt + 3) = (*(byte *)(cnt + 4) & 0x20) != 0;
    pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,1);
    BVar1 = pvVar5->state_rising;
    pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,2);
    BVar2 = pvVar5->state_rising;
    pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,3);
    BVar3 = pvVar5->state_rising;
    pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,4);
    local_2c = (uint)(BVar1 == BIT_HIGH) + (uint)(BVar2 == BIT_HIGH) + (uint)(BVar3 == BIT_HIGH) +
               (uint)(pvVar5->state_rising == BIT_HIGH);
    if ((uint)*(byte *)(cnt + 3) == (local_2c & 1)) {
      SWDOperation::SetRegister((SWDOperation *)cnt,this->mSelectRegister);
      pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,9);
      BVar1 = pvVar5->state_rising;
      pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,10);
      cVar7 = '\0';
      if (pvVar5->state_rising == BIT_HIGH) {
        cVar7 = '\x02';
      }
      pvVar5 = std::vector<SWDBit,_std::allocator<SWDBit>_>::operator[](&this->mBitsBuffer,0xb);
      cVar8 = '\0';
      if (pvVar5->state_rising == BIT_HIGH) {
        cVar8 = '\x04';
      }
      *(char *)(cnt + 5) = (BVar1 == BIT_HIGH) + cVar7 + cVar8;
      if ((*(char *)(cnt + 5) == '\x02') || (*(char *)(cnt + 5) == '\x04')) {
        std::vector<SWDBit,_std::allocator<SWDBit>_>::clear
                  ((vector<SWDBit,_std::allocator<SWDBit>_> *)(cnt + 0x10));
        local_38._M_current =
             (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
        local_48._M_current =
             (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
        local_40 = __gnu_cxx::
                   __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                   operator+(&local_48,0xc);
        local_50 = (vector<SWDBit,_std::allocator<SWDBit>_> *)
                   std::back_inserter<std::vector<SWDBit,std::allocator<SWDBit>>>
                             ((vector<SWDBit,_std::allocator<SWDBit>_> *)(cnt + 0x10));
        local_58 = (vector<SWDBit,_std::allocator<SWDBit>_> *)
                   std::
                   copy<__gnu_cxx::__normal_iterator<SWDBit*,std::vector<SWDBit,std::allocator<SWDBit>>>,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                             (local_38,local_40,
                              (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)
                              local_50);
        local_68._M_current =
             (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
        __gnu_cxx::__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>>::
        __normal_iterator<SWDBit*>
                  ((__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>> *)
                   &local_60,&local_68);
        local_80._M_current =
             (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
        local_78 = __gnu_cxx::
                   __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                   operator+(&local_80,0xc);
        __gnu_cxx::__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>>::
        __normal_iterator<SWDBit*>
                  ((__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>> *)
                   &local_70,&local_78);
        std::vector<SWDBit,_std::allocator<SWDBit>_>::erase(&this->mBitsBuffer,local_60,local_70);
        this_local._7_1_ = true;
      }
      else if (*(char *)(cnt + 5) == '\x01') {
        BufferBits(this,0x2d);
        bi._M_current._7_1_ = 1;
        ndx = (size_t)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
        local_98 = __gnu_cxx::
                   __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                   operator+((__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>
                              *)&ndx,0xc);
        bVar4 = SWDOperation::IsRead((SWDOperation *)cnt);
        if (!bVar4) {
          BufferBits(this,0x2e);
          __gnu_cxx::__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
          operator++(&local_98);
        }
        *(undefined4 *)(cnt + 8) = 0;
        local_2c = 0;
        for (uStack_a8 = 0; uStack_a8 < 0x20; uStack_a8 = uStack_a8 + 1) {
          *(uint *)(cnt + 8) = *(uint *)(cnt + 8) >> 1;
          pSVar6 = __gnu_cxx::
                   __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                   operator[](&local_98,uStack_a8);
          bVar4 = SWDBit::IsHigh(pSVar6,(bool)(bi._M_current._7_1_ & 1));
          if (bVar4) {
            *(uint *)(cnt + 8) = *(uint *)(cnt + 8) | 0x80000000;
            local_2c = local_2c + 1;
          }
        }
        pSVar6 = __gnu_cxx::
                 __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                 operator[](&local_98,uStack_a8);
        bVar4 = SWDBit::IsHigh(pSVar6,(bool)(bi._M_current._7_1_ & 1));
        *(bool *)(cnt + 0xc) = bVar4;
        *(bool *)(cnt + 0xd) = (uint)*(byte *)(cnt + 0xc) == (local_2c & 1);
        if ((*(byte *)(cnt + 0xd) & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          if ((*(int *)(cnt + 0x28) == 6) && ((*(byte *)(cnt + 1) & 1) == 0)) {
            this->mSelectRegister = *(U32 *)(cnt + 8);
          }
          local_a9 = 1;
          do {
            uStack_a8 = uStack_a8 + 1;
            local_b8 = __gnu_cxx::
                       __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                       operator+(&local_98,uStack_a8);
            bit.low_end = (S64)std::vector<SWDBit,_std::allocator<SWDBit>_>::end(&this->mBitsBuffer)
            ;
            bVar4 = __gnu_cxx::operator<
                              (&local_b8,
                               (__normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>
                                *)&bit.low_end);
            if (!bVar4) goto LAB_00115d90;
            pSVar6 = __gnu_cxx::
                     __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                     operator[](&local_98,uStack_a8);
            bVar4 = SWDBit::IsHigh(pSVar6,(bool)(bi._M_current._7_1_ & 1));
          } while (!bVar4);
          local_a9 = 0;
LAB_00115d90:
          if ((local_a9 & 1) == 0) {
            std::vector<SWDBit,_std::allocator<SWDBit>_>::clear
                      ((vector<SWDBit,_std::allocator<SWDBit>_> *)(cnt + 0x10));
            local_118._M_current =
                 (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
            local_128._M_current =
                 (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
            local_120 = __gnu_cxx::
                        __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                        operator+(&local_128,uStack_a8);
            local_130 = (vector<SWDBit,_std::allocator<SWDBit>_> *)
                        std::back_inserter<std::vector<SWDBit,std::allocator<SWDBit>>>
                                  ((vector<SWDBit,_std::allocator<SWDBit>_> *)(cnt + 0x10));
            local_138 = (vector<SWDBit,_std::allocator<SWDBit>_> *)
                        std::
                        copy<__gnu_cxx::__normal_iterator<SWDBit*,std::vector<SWDBit,std::allocator<SWDBit>>>,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                                  (local_118,local_120,
                                   (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>
                                    )local_130);
            local_148._M_current =
                 (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
            __gnu_cxx::__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>>::
            __normal_iterator<SWDBit*>
                      ((__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>>
                        *)&local_140,&local_148);
            local_160._M_current =
                 (SWDBit *)std::vector<SWDBit,_std::allocator<SWDBit>_>::begin(&this->mBitsBuffer);
            local_158 = __gnu_cxx::
                        __normal_iterator<SWDBit_*,_std::vector<SWDBit,_std::allocator<SWDBit>_>_>::
                        operator+(&local_160,uStack_a8);
            __gnu_cxx::__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>>::
            __normal_iterator<SWDBit*>
                      ((__normal_iterator<SWDBit_const*,std::vector<SWDBit,std::allocator<SWDBit>>>
                        *)&local_150,&local_158);
            std::vector<SWDBit,_std::allocator<SWDBit>_>::erase
                      (&this->mBitsBuffer,local_140,local_150);
          }
          else {
            while( true ) {
              ParseBit(&local_110,this);
              memcpy(local_e8,&local_110,0x28);
              bVar4 = SWDBit::IsHigh((SWDBit *)local_e8,(bool)(bi._M_current._7_1_ & 1));
              if (bVar4) break;
              std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back
                        (&this->mBitsBuffer,(value_type *)local_e8);
            }
            std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=
                      ((vector<SWDBit,_std::allocator<SWDBit>_> *)(cnt + 0x10),&this->mBitsBuffer);
            std::vector<SWDBit,_std::allocator<SWDBit>_>::clear(&this->mBitsBuffer);
            std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back
                      (&this->mBitsBuffer,(value_type *)local_e8);
          }
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SWDParser::IsOperation( SWDOperation& tran )
{
    tran.Clear();

    // read enough bits so that we don't have to worry of subscripts out of range
    BufferBits( TRAN_REQ_AND_ACK );

    // turn the bits into a byte
    tran.request_byte = 0;
    for( size_t cnt = 0; cnt < 8; ++cnt )
    {
        tran.request_byte >>= 1;
        tran.request_byte |= ( mBitsBuffer[ cnt ].IsHigh() ? 0x80 : 0 );
    }

    // are the request's constant bits (start, stop & park) wrong?
    if( ( tran.request_byte & 0xC1 ) != 0x81 )
        return false;

    // get the indivitual bits
    tran.APnDP = ( tran.request_byte & 0x02 ) != 0;                   //(mBitsBuffer[1].state_falling == BIT_HIGH);
    tran.RnW = ( tran.request_byte & 0x04 ) != 0;                     //(mBitsBuffer[2].state_falling == BIT_HIGH);
    tran.addr = ( tran.request_byte & 0x18 ) >> 1;                    //(mBitsBuffer[3].state_falling == BIT_HIGH ? (1<<2) : 0)
                                                                      //| (mBitsBuffer[4].state_falling == BIT_HIGH ? (1<<3) : 0);
    tran.parity_read = ( ( tran.request_byte & 0x20 ) != 0 ? 1 : 0 ); //(mBitsBuffer[5].state_falling == BIT_HIGH ? 1 : 0);

    // check parity
    int check = ( mBitsBuffer[ 1 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 2 ].state_rising == BIT_HIGH ? 1 : 0 ) +
                ( mBitsBuffer[ 3 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 4 ].state_rising == BIT_HIGH ? 1 : 0 );

    if( tran.parity_read != ( check & 1 ) )
        return false;

    // Set the actual register in this operation based on the data from the request
    // and the previous select register state.
    tran.SetRegister( mSelectRegister );

    // get the ACK value
    tran.ACK = ( mBitsBuffer[ 9 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 10 ].state_rising == BIT_HIGH ? 2 : 0 ) +
               ( mBitsBuffer[ 11 ].state_rising == BIT_HIGH ? 4 : 0 );

    // we're only handling OK, WAIT and FAULT responses
    if( tran.ACK == ACK_WAIT || tran.ACK == ACK_FAULT )
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK, std::back_inserter( tran.bits ) );

        // consume this operation's bits
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK );

        return true;
    }

    if( tran.ACK != ACK_OK )
        return false;

    BufferBits( TRAN_READ_LENGTH );

    // turnaround if write operation
    bool read_rising = true;
    std::vector<SWDBit>::iterator bi( mBitsBuffer.begin() + 12 );
    if( !tran.IsRead() )
    {
        BufferBits( TRAN_WRITE_LENGTH );
        ++bi;
        // !!! read_rising = false;
    }

    // read the data
    tran.data = 0;
    check = 0;
    size_t ndx;
    for( ndx = 0; ndx < 32; ndx++ )
    {
        tran.data >>= 1;

        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            tran.data |= 0x80000000;
            ++check;
        }
    }

    // data parity
    tran.data_parity = bi[ ndx ].IsHigh( read_rising ) ? 1 : 0;

    tran.data_parity_ok = ( tran.data_parity == ( check & 1 ) );

    if( !tran.data_parity_ok )
        return false;

    // if this is a SELECT register write, remember the value
    if( tran.reg == SWDR_DP_SELECT && !tran.RnW )
        mSelectRegister = tran.data;

    // buffered trailing zeros
    ++ndx;
    bool all_zeros = true;
    while( bi + ndx < mBitsBuffer.end() )
    {
        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            all_zeros = false;
            break;
        }

        ++ndx;
    }

    // if we haven't seen a high bit carry on until we do
    if( all_zeros )
    {
        // read the remaining zero bits
        SWDBit bit;
        while( 1 )
        {
            bit = ParseBit();
            if( bit.IsHigh( read_rising ) )
                break;

            mBitsBuffer.push_back( bit );
        }

        // give the bits to the tran object
        tran.bits = mBitsBuffer;
        mBitsBuffer.clear();

        // keep the high bit because that one is probably next operation's start bit
        mBitsBuffer.push_back( bit );
    }
    else
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx, std::back_inserter( tran.bits ) );

        // remove this operation's bits from the buffer
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx );
    }

    return true;
}